

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPrivate::removeFieldAt(QWizardPrivate *this,int index)

{
  bool bVar1;
  QObject *pQVar2;
  const_reference pQVar3;
  char *pcVar4;
  int in_ESI;
  QWizardPrivate *in_RDI;
  QWizardField *field;
  QWizard *q;
  qsizetype in_stack_ffffffffffffffc8;
  QList<QWizardField> *in_stack_ffffffffffffffd0;
  QObject *pQVar5;
  
  pQVar2 = (QObject *)q_func(in_RDI);
  pQVar3 = QList<QWizardField>::at(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  QMap<QString,_int>::remove(&in_RDI->fieldIndexMap,(char *)&pQVar3->name);
  if ((pQVar3->mandatory & 1U) != 0) {
    bVar1 = QByteArray::isEmpty((QByteArray *)0x7b54f2);
    if (!bVar1) {
      pQVar5 = pQVar3->object;
      pcVar4 = QByteArray::operator_cast_to_char_((QByteArray *)0x7b5512);
      QObject::disconnect(pQVar5,pcVar4,(QObject *)pQVar3->page,"1_q_maybeEmitCompleteChanged()");
    }
  }
  QObject::disconnect(pQVar3->object,"2destroyed(QObject*)",pQVar2,
                      "1_q_handleFieldObjectDestroyed(QObject*)");
  QList<QWizardField>::remove(&in_RDI->fields,(char *)(long)in_ESI);
  return;
}

Assistant:

void QWizardPrivate::removeFieldAt(int index)
{
    Q_Q(QWizard);

    const QWizardField &field = fields.at(index);
    fieldIndexMap.remove(field.name);
    if (field.mandatory && !field.changedSignal.isEmpty())
        QObject::disconnect(field.object, field.changedSignal,
                            field.page, SLOT(_q_maybeEmitCompleteChanged()));
    QObject::disconnect(
        field.object, SIGNAL(destroyed(QObject*)), q,
        SLOT(_q_handleFieldObjectDestroyed(QObject*)));
    fields.remove(index);
}